

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O0

void vector_suite::test_bool_one(void)

{
  _Bit_pointer *this;
  undefined1 local_119;
  reference local_118;
  undefined4 local_104;
  size_type local_100 [3];
  char *msg;
  undefined1 local_d8 [8];
  vector<bool,_std::allocator<bool>_> value;
  iarchive in;
  value_type input [4];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 0x93810192;
  this = &value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[4]>
            ((iarchive *)this,
             (uchar (*) [4])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x4c));
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_d8);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)this,
             (vector<bool,_std::allocator<bool>_> *)local_d8);
  local_100[0] = std::vector<bool,_std::allocator<bool>_>::size
                           ((vector<bool,_std::allocator<bool>_> *)local_d8);
  local_104 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,400,"void vector_suite::test_bool_one()",local_100,&local_104);
  local_118 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_d8,0);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::_Bit_reference,bool>
            ("value[0]","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x191,"void vector_suite::test_bool_one()",&local_118,&local_119);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_d8)
  ;
  trial::protocol::bintoken::iarchive::~iarchive
            ((iarchive *)
             &value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void test_bool_one()
{
    const value_type input[] = { token::code::begin_array,
                                 0x01,
                                 token::code::true_value,
                                 token::code::end_array };
    format::iarchive in(input);
    std::vector<bool> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], true);
}